

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

int garray_getfloatarray(_garray *x,int *size,t_float **vec)

{
  int iVar1;
  _glist *p_Var2;
  
  p_Var2 = x->x_glist->gl_owner;
  if (p_Var2 == (_glist *)0x0) {
    p_Var2 = x->x_glist;
  }
  pd_error((void *)0x0,"an operation on the array \'%s\' in the patch \'%s\'",x->x_name->s_name,
           p_Var2->gl_name->s_name);
  pd_error((void *)0x0,"failed since it uses garray_getfloatarray while running 64-bit");
  iVar1 = garray_getfloatwords(x,size,(t_word **)vec);
  return iVar1;
}

Assistant:

int garray_getfloatarray(t_garray *x, int *size, t_float **vec)
{
    if (sizeof(t_word) != sizeof(t_float))
    {
        t_symbol *patchname;
        if (x->x_glist->gl_owner)
            patchname = x->x_glist->gl_owner->gl_name;
        else
            patchname = x->x_glist->gl_name;
        pd_error(0, "an operation on the array '%s' in the patch '%s'",
              x->x_name->s_name, patchname->s_name);
        pd_error(0, "failed since it uses garray_getfloatarray while running 64-bit");
    }
    return (garray_getfloatwords(x, size, (t_word **)vec));
}